

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataQueryDatumSpecification.cpp
# Opt level: O2

void __thiscall
DIS::DataQueryDatumSpecification::unmarshal
          (DataQueryDatumSpecification *this,DataStream *dataStream)

{
  size_t idx_1;
  size_t idx;
  ulong uVar1;
  UnsignedDISInteger x;
  UnsignedDISInteger local_40;
  
  DataStream::operator>>(dataStream,&this->_numberOfFixedDatums);
  DataStream::operator>>(dataStream,&this->_numberOfVariableDatums);
  std::vector<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>::clear
            (&this->_fixedDatumIDList);
  for (uVar1 = 0; uVar1 < this->_numberOfFixedDatums; uVar1 = uVar1 + 1) {
    UnsignedDISInteger::UnsignedDISInteger(&local_40);
    UnsignedDISInteger::unmarshal(&local_40,dataStream);
    std::vector<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>::push_back
              (&this->_fixedDatumIDList,&local_40);
    UnsignedDISInteger::~UnsignedDISInteger(&local_40);
  }
  std::vector<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>::clear
            (&this->_variableDatumIDList);
  for (uVar1 = 0; uVar1 < this->_numberOfVariableDatums; uVar1 = uVar1 + 1) {
    UnsignedDISInteger::UnsignedDISInteger(&local_40);
    UnsignedDISInteger::unmarshal(&local_40,dataStream);
    std::vector<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>::push_back
              (&this->_variableDatumIDList,&local_40);
    UnsignedDISInteger::~UnsignedDISInteger(&local_40);
  }
  return;
}

Assistant:

void DataQueryDatumSpecification::unmarshal(DataStream& dataStream)
{
    dataStream >> _numberOfFixedDatums;
    dataStream >> _numberOfVariableDatums;

     _fixedDatumIDList.clear();
     for(size_t idx = 0; idx < _numberOfFixedDatums; idx++)
     {
        UnsignedDISInteger x;
        x.unmarshal(dataStream);
        _fixedDatumIDList.push_back(x);
     }

     _variableDatumIDList.clear();
     for(size_t idx = 0; idx < _numberOfVariableDatums; idx++)
     {
        UnsignedDISInteger x;
        x.unmarshal(dataStream);
        _variableDatumIDList.push_back(x);
     }
}